

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

BaseType __thiscall
diligent_spirv_cross::CompilerGLSL::get_builtin_basetype
          (CompilerGLSL *this,BuiltIn builtin,BaseType default_type)

{
  if ((((BuiltInSampleMask < builtin) || ((0x100680U >> (builtin & BuiltInGlobalSize) & 1) == 0)) &&
      (builtin != BuiltInPrimitiveShadingRateKHR)) &&
     ((builtin != BuiltInShadingRateKHR && (builtin != BuiltInFragStencilRefEXT)))) {
    return default_type;
  }
  return Int;
}

Assistant:

SPIRType::BaseType CompilerGLSL::get_builtin_basetype(BuiltIn builtin, SPIRType::BaseType default_type)
{
	// TODO: Fill in for more builtins.
	switch (builtin)
	{
	case BuiltInLayer:
	case BuiltInPrimitiveId:
	case BuiltInViewportIndex:
	case BuiltInFragStencilRefEXT:
	case BuiltInSampleMask:
	case BuiltInPrimitiveShadingRateKHR:
	case BuiltInShadingRateKHR:
		return SPIRType::Int;

	default:
		return default_type;
	}
}